

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

cf_bool_t cf_array_reserve(cf_array_t *self,int count)

{
  bool bVar1;
  
  if (count < 0) {
    count = (int)self->capacity;
  }
  bVar1 = count <= (int)self->capacity;
  if (bVar1) {
    self->elm_count = (long)count;
    cf_membzero(self->elm_start,(long)count * self->elm_size);
  }
  return (uint)bVar1;
}

Assistant:

cf_bool_t cf_array_reserve(cf_array_t* self, int count) {
    if (count < 0) {
        count = self->capacity;
    }
    if (count > (int)self->capacity) {
        return CF_FALSE;
    }
    self->elm_count = count;
    cf_membzero(self->elm_start, self->elm_size * count);
    return CF_TRUE;
}